

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTessellationTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::checkTessellationSupport
               (NegativeTestContext *ctx)

{
  NotSupportedError *this;
  bool bVar1;
  long *plVar2;
  size_type *psVar3;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  bVar1 = glu::ContextInfo::isExtensionSupported((ContextInfo *)ctx,"GL_EXT_tessellation_shader");
  if (bVar1) {
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"GL_EXT_tessellation_shader","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_68);
  local_48._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_48._M_dataplus._M_p == psVar3) {
    local_48.field_2._M_allocated_capacity = *psVar3;
    local_48.field_2._8_8_ = plVar2[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar3;
  }
  local_48._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError(this,&local_48);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void checkExtensionSupport (NegativeTestContext& ctx, const char* extName)
{
	if (!ctx.getContextInfo().isExtensionSupported(extName))
		throw tcu::NotSupportedError(string(extName) + " not supported");
}